

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O0

void __thiscall Diligent::VAOCache::OnDestroyBuffer(VAOCache *this,BufferGLImpl *Buffer)

{
  bool bVar1;
  pointer ppVar2;
  reference __x;
  VAOHashKey *Key;
  iterator __end2;
  iterator __begin2;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> *__range2;
  Int32 local_54;
  _Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
  local_50;
  iterator it;
  lock_guard<Threading::SpinLock> local_38;
  SpinLockGuard CacheGuard;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> StaleKeys;
  BufferGLImpl *Buffer_local;
  VAOCache *this_local;
  
  std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>::
  vector((vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> *)
         &CacheGuard);
  std::lock_guard<Threading::SpinLock>::lock_guard(&local_38,&this->m_CacheLock);
  local_54 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                            *)Buffer);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
       ::find(&this->m_BuffToKey,&local_54);
  __range2 = (vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
              *)std::
                unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
                ::end(&this->m_BuffToKey);
  bVar1 = std::__detail::operator!=
                    (&local_50,
                     (_Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
                      *)&__range2);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false,_false>
                           *)&local_50);
    __end2 = std::
             vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
             ::begin(&ppVar2->second);
    Key = (VAOHashKey *)
          std::
          vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>::
          end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Diligent::VAOCache::VAOHashKey_*,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>
                                       *)&Key), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<Diligent::VAOCache::VAOHashKey_*,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>
            ::operator*(&__end2);
      std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>::
      push_back((vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                 *)&CacheGuard,__x);
      std::
      unordered_map<Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>_>
      ::erase(&this->m_Cache,__x);
      __gnu_cxx::
      __normal_iterator<Diligent::VAOCache::VAOHashKey_*,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>
      ::operator++(&__end2);
    }
    std::
    unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
    ::erase(&this->m_BuffToKey,(iterator)local_50._M_cur);
  }
  ClearStaleKeys(this,(vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                       *)&CacheGuard);
  std::lock_guard<Threading::SpinLock>::~lock_guard(&local_38);
  std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>::
  ~vector((vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> *
          )&CacheGuard);
  return;
}

Assistant:

void VAOCache::OnDestroyBuffer(const BufferGLImpl& Buffer)
{
    // Collect all stale keys that use this buffer.
    std::vector<VAOHashKey> StaleKeys;

    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    const auto it = m_BuffToKey.find(Buffer.GetUniqueID());
    if (it != m_BuffToKey.end())
    {
        for (const auto& Key : it->second)
        {
            StaleKeys.push_back(Key);
            m_Cache.erase(Key);
        }
        m_BuffToKey.erase(it);
    }

    // Clear stale entries in m_PSOToKey and m_BuffToKey that refer to dead VAOs
    // to avoid memory leaks.
    ClearStaleKeys(StaleKeys);
}